

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sol_check_data.h
# Opt level: O2

void __thiscall
mp::SolCheck::SolCheck
          (SolCheck *this,ArrayRef<double> *x,ValueMapDbl *param_2,ArrayRef<double> *obj,
          ArrayRef<double> *x_raw,ArrayRef<mp::var::Type> *vtype,ArrayRef<double> lb,
          ArrayRef<double> ub,double feastol,double feastolrel,int sol_rnd,int sol_prec,
          bool recomp_vals,int chk_mode)

{
  _Rb_tree_header *p_Var1;
  _Vector_base<double,_std::allocator<double>_> local_100;
  ArrayRef<double> local_e8;
  ArrayRef<double> local_b8;
  ArrayRef<mp::var::Type> local_88;
  ArrayRef<double> local_58;
  
  ArrayRef::operator_cast_to_vector
            ((vector<double,_std::allocator<double>_> *)&local_100,(ArrayRef *)x);
  local_58.save_.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data
  ._M_end_of_storage = (pointer)0x0;
  local_58.save_.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data
  ._M_start = (pointer)0x0;
  local_58.save_.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data
  ._M_finish = (pointer)0x0;
  local_58.data_ = x_raw->data_;
  local_58.size_ = x_raw->size_;
  local_88.save_.super__Vector_base<mp::var::Type,_std::allocator<mp::var::Type>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  local_88.save_.super__Vector_base<mp::var::Type,_std::allocator<mp::var::Type>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  local_88.save_.super__Vector_base<mp::var::Type,_std::allocator<mp::var::Type>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  local_88.data_ = vtype->data_;
  local_88.size_ = vtype->size_;
  local_b8.save_.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data
  ._M_start = (pointer)0x0;
  local_b8.save_.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data
  ._M_finish = (pointer)0x0;
  local_b8.save_.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data
  ._M_end_of_storage = (pointer)0x0;
  local_b8.data_ =
       (double *)
       lb.save_.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
       _M_start[3];
  local_b8.size_ =
       (size_t)lb.save_.super__Vector_base<double,_std::allocator<double>_>._M_impl.
               super__Vector_impl_data._M_start[4];
  local_e8.save_.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data
  ._M_start = (pointer)0x0;
  local_e8.save_.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data
  ._M_finish = (pointer)0x0;
  local_e8.save_.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data
  ._M_end_of_storage = (pointer)0x0;
  local_e8.data_ =
       (double *)
       lb.save_.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
       _M_finish[3];
  local_e8.size_ =
       (size_t)lb.save_.super__Vector_base<double,_std::allocator<double>_>._M_impl.
               super__Vector_impl_data._M_finish[4];
  VarInfoImpl<std::vector<double,_std::allocator<double>_>_>::VarInfoImpl
            (&this->x_,feastol,lb.size_._0_1_,(vector<double,_std::allocator<double>_> *)&local_100,
             &local_58,&local_88,&local_b8,&local_e8,
             (int)lb.save_.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                  super__Vector_impl_data._M_end_of_storage,(int)lb.data_);
  std::_Vector_base<double,_std::allocator<double>_>::~_Vector_base
            ((_Vector_base<double,_std::allocator<double>_> *)&local_e8);
  std::_Vector_base<double,_std::allocator<double>_>::~_Vector_base
            ((_Vector_base<double,_std::allocator<double>_> *)&local_b8);
  std::_Vector_base<mp::var::Type,_std::allocator<mp::var::Type>_>::~_Vector_base
            ((_Vector_base<mp::var::Type,_std::allocator<mp::var::Type>_> *)&local_88);
  std::_Vector_base<double,_std::allocator<double>_>::~_Vector_base
            ((_Vector_base<double,_std::allocator<double>_> *)&local_58);
  std::_Vector_base<double,_std::allocator<double>_>::~_Vector_base(&local_100);
  (this->obj_).save_.super__Vector_base<double,_std::allocator<double>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  (this->obj_).save_.super__Vector_base<double,_std::allocator<double>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  (this->obj_).save_.super__Vector_base<double,_std::allocator<double>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  (this->obj_).data_ = obj->data_;
  (this->obj_).size_ = obj->size_;
  this->feastol_ = feastol;
  this->feastolrel_ = feastolrel;
  this->fRecomputedVals_ = lb.size_._0_1_;
  this->check_mode_ =
       (int)ub.save_.super__Vector_base<double,_std::allocator<double>_>._M_impl.
            super__Vector_impl_data._M_start;
  (this->report_)._M_dataplus._M_p = (pointer)&(this->report_).field_2;
  (this->report_)._M_string_length = 0;
  (this->report_).field_2._M_local_buf[0] = '\0';
  (this->viol_var_bnds_)._M_elems[0].N_ = 0;
  (this->viol_var_bnds_)._M_elems[1].N_ = 0;
  (this->viol_var_bnds_)._M_elems[0].epsAbsMax_ = 0.0;
  (this->viol_var_bnds_)._M_elems[0].nameAbs_ = (char *)0x0;
  (this->viol_var_bnds_)._M_elems[0].epsRelMax_ = 0.0;
  (this->viol_var_bnds_)._M_elems[0].nameRel_ = (char *)0x0;
  (this->viol_var_int_)._M_elems[1].epsAbsMax_ = 0.0;
  (this->viol_var_int_)._M_elems[1].nameAbs_ = (char *)0x0;
  (this->viol_var_int_)._M_elems[1].epsRelMax_ = 0.0;
  (this->viol_var_int_)._M_elems[1].nameRel_ = (char *)0x0;
  (this->viol_var_int_)._M_elems[0].epsAbsMax_ = 0.0;
  (this->viol_var_int_)._M_elems[0].nameAbs_ = (char *)0x0;
  (this->viol_var_int_)._M_elems[1].N_ = 0;
  (this->viol_var_int_)._M_elems[0].epsRelMax_ = 0.0;
  (this->viol_var_int_)._M_elems[0].nameRel_ = (char *)0x0;
  (this->viol_cons_alg_)._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  (this->viol_cons_alg_)._M_t._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
  p_Var1 = &(this->viol_cons_alg_)._M_t._M_impl.super__Rb_tree_header;
  (this->viol_var_bnds_)._M_elems[1].epsRelMax_ = 0.0;
  (this->viol_var_bnds_)._M_elems[1].nameRel_ = (char *)0x0;
  (this->viol_var_bnds_)._M_elems[1].epsAbsMax_ = 0.0;
  (this->viol_var_bnds_)._M_elems[1].nameAbs_ = (char *)0x0;
  (this->viol_var_int_)._M_elems[0].N_ = 0;
  (this->viol_cons_alg_)._M_t._M_impl.super__Rb_tree_header._M_header._M_left = &p_Var1->_M_header;
  (this->viol_cons_alg_)._M_t._M_impl.super__Rb_tree_header._M_header._M_right = &p_Var1->_M_header;
  (this->viol_cons_alg_)._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
  p_Var1 = &(this->viol_cons_log_)._M_t._M_impl.super__Rb_tree_header;
  (this->viol_cons_log_)._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  (this->viol_cons_log_)._M_t._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
  (this->viol_cons_log_)._M_t._M_impl.super__Rb_tree_header._M_header._M_left = &p_Var1->_M_header;
  (this->viol_cons_log_)._M_t._M_impl.super__Rb_tree_header._M_header._M_right = &p_Var1->_M_header;
  (this->viol_cons_log_)._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
  (this->viol_obj_).N_ = 0;
  (this->viol_obj_).epsAbsMax_ = 0.0;
  (this->viol_obj_).nameAbs_ = (char *)0x0;
  (this->viol_obj_).epsRelMax_ = 0.0;
  (this->viol_obj_).nameRel_ = (char *)0x0;
  return;
}

Assistant:

SolCheck(ArrayRef<double> x,
           const pre::ValueMapDbl& , //duals,
           ArrayRef<double> obj,
           ArrayRef<double> x_raw,
           ArrayRef<var::Type> vtype,
           ArrayRef<double> lb,  ArrayRef<double> ub,
           double feastol, double feastolrel,
           int sol_rnd, int sol_prec,
           bool recomp_vals, int chk_mode)
      : x_(feastol, recomp_vals,
           x, x_raw, vtype, lb, ub, sol_rnd, sol_prec),
      obj_(obj),
      feastol_(feastol), feastolrel_(feastolrel),
      fRecomputedVals_(recomp_vals),
      check_mode_(chk_mode) { }